

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  AABBNodeMB4D *node1;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  float fVar42;
  float fVar47;
  float fVar48;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar82;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  float fVar91;
  undefined1 auVar92 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar93 [64];
  undefined1 auVar97 [16];
  uint uVar99;
  uint uVar100;
  uint uVar101;
  undefined1 auVar98 [64];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  float fVar105;
  float fVar111;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar109;
  float fVar110;
  undefined1 auVar108 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_a1c;
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  RTCIntersectArguments *local_9f0;
  long local_9e8;
  RayQueryContext *local_9e0;
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  long local_9b0;
  long local_9a8;
  long local_9a0;
  ulong local_998;
  ulong *local_990;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  uint local_970;
  uint local_96c;
  uint local_968;
  RTCFilterFunctionNArguments local_958;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar42 = ray->tfar;
    if (0.0 <= fVar42) {
      local_9e0 = context;
      local_990 = local_7d8 + 1;
      aVar4 = (ray->dir).field_0;
      auVar43 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar52._8_4_ = 0x7fffffff;
      auVar52._0_8_ = 0x7fffffff7fffffff;
      auVar52._12_4_ = 0x7fffffff;
      auVar52 = vandps_avx((undefined1  [16])aVar4,auVar52);
      auVar83._8_4_ = 0x219392ef;
      auVar83._0_8_ = 0x219392ef219392ef;
      auVar83._12_4_ = 0x219392ef;
      auVar52 = vcmpps_avx(auVar52,auVar83,1);
      auVar52 = vblendvps_avx((undefined1  [16])aVar4,auVar83,auVar52);
      auVar83 = vrcpps_avx(auVar52);
      fVar47 = auVar83._0_4_;
      auVar73._0_4_ = fVar47 * auVar52._0_4_;
      fVar48 = auVar83._4_4_;
      auVar73._4_4_ = fVar48 * auVar52._4_4_;
      fVar49 = auVar83._8_4_;
      auVar73._8_4_ = fVar49 * auVar52._8_4_;
      fVar82 = auVar83._12_4_;
      auVar73._12_4_ = fVar82 * auVar52._12_4_;
      auVar84._8_4_ = 0x3f800000;
      auVar84._0_8_ = 0x3f8000003f800000;
      auVar84._12_4_ = 0x3f800000;
      auVar52 = vsubps_avx(auVar84,auVar73);
      auVar74._0_4_ = fVar47 + fVar47 * auVar52._0_4_;
      auVar74._4_4_ = fVar48 + fVar48 * auVar52._4_4_;
      auVar74._8_4_ = fVar49 + fVar49 * auVar52._8_4_;
      auVar74._12_4_ = fVar82 + fVar82 * auVar52._12_4_;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_8a8._4_4_ = uVar3;
      local_8a8._0_4_ = uVar3;
      local_8a8._8_4_ = uVar3;
      local_8a8._12_4_ = uVar3;
      auVar88 = ZEXT1664(local_8a8);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_8b8._4_4_ = uVar3;
      local_8b8._0_4_ = uVar3;
      local_8b8._8_4_ = uVar3;
      local_8b8._12_4_ = uVar3;
      auVar90 = ZEXT1664(local_8b8);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_8c8._4_4_ = uVar3;
      local_8c8._0_4_ = uVar3;
      local_8c8._8_4_ = uVar3;
      local_8c8._12_4_ = uVar3;
      auVar93 = ZEXT1664(local_8c8);
      local_8d8 = vshufps_avx(auVar74,auVar74,0);
      auVar98 = ZEXT1664(local_8d8);
      auVar52 = vmovshdup_avx(auVar74);
      local_8e8 = vshufps_avx(auVar74,auVar74,0x55);
      auVar103 = ZEXT1664(local_8e8);
      auVar83 = vshufpd_avx(auVar74,auVar74,1);
      local_8f8 = vshufps_avx(auVar74,auVar74,0xaa);
      auVar104 = ZEXT1664(local_8f8);
      local_998 = (ulong)(auVar74._0_4_ < 0.0) << 4;
      uVar39 = (ulong)(auVar52._0_4_ < 0.0) << 4 | 0x20;
      uVar38 = (ulong)(auVar83._0_4_ < 0.0) << 4 | 0x40;
      uVar40 = local_998 ^ 0x10;
      local_908 = vshufps_avx(auVar43,auVar43,0);
      auVar86 = ZEXT1664(local_908);
      local_918 = vshufps_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),0);
      auVar108 = ZEXT1664(local_918);
      local_928 = mm_lookupmask_ps._240_8_;
      uStack_920 = mm_lookupmask_ps._248_8_;
LAB_00b6b22e:
      if (local_990 != local_7d8) {
        uVar41 = local_990[-1];
        local_990 = local_990 + -1;
        do {
          fVar42 = (ray->dir).field_0.m128[3];
          auVar43._4_4_ = fVar42;
          auVar43._0_4_ = fVar42;
          auVar43._8_4_ = fVar42;
          auVar43._12_4_ = fVar42;
          do {
            if ((uVar41 & 8) != 0) {
              local_9a0 = (ulong)((uint)uVar41 & 0xf) - 8;
              uVar41 = uVar41 & 0xfffffffffffffff0;
              local_9a8 = 0;
              goto LAB_00b6b3c0;
            }
            uVar33 = uVar41 & 0xfffffffffffffff0;
            pfVar2 = (float *)(uVar33 + 0x80 + local_998);
            pfVar1 = (float *)(uVar33 + 0x20 + local_998);
            auVar50._0_4_ = fVar42 * *pfVar2 + *pfVar1;
            auVar50._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
            auVar50._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
            auVar50._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
            auVar52 = vsubps_avx(auVar50,auVar88._0_16_);
            auVar51._0_4_ = auVar98._0_4_ * auVar52._0_4_;
            auVar51._4_4_ = auVar98._4_4_ * auVar52._4_4_;
            auVar51._8_4_ = auVar98._8_4_ * auVar52._8_4_;
            auVar51._12_4_ = auVar98._12_4_ * auVar52._12_4_;
            pfVar2 = (float *)(uVar33 + 0x80 + uVar39);
            auVar52 = vmaxps_avx(auVar86._0_16_,auVar51);
            pfVar1 = (float *)(uVar33 + 0x20 + uVar39);
            auVar63._0_4_ = fVar42 * *pfVar2 + *pfVar1;
            auVar63._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
            auVar63._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
            auVar63._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
            auVar83 = vsubps_avx(auVar63,auVar90._0_16_);
            pfVar2 = (float *)(uVar33 + 0x80 + uVar38);
            pfVar1 = (float *)(uVar33 + 0x20 + uVar38);
            auVar75._0_4_ = fVar42 * *pfVar2 + *pfVar1;
            auVar75._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
            auVar75._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
            auVar75._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
            auVar64._0_4_ = auVar103._0_4_ * auVar83._0_4_;
            auVar64._4_4_ = auVar103._4_4_ * auVar83._4_4_;
            auVar64._8_4_ = auVar103._8_4_ * auVar83._8_4_;
            auVar64._12_4_ = auVar103._12_4_ * auVar83._12_4_;
            auVar83 = vsubps_avx(auVar75,auVar93._0_16_);
            auVar76._0_4_ = auVar104._0_4_ * auVar83._0_4_;
            auVar76._4_4_ = auVar104._4_4_ * auVar83._4_4_;
            auVar76._8_4_ = auVar104._8_4_ * auVar83._8_4_;
            auVar76._12_4_ = auVar104._12_4_ * auVar83._12_4_;
            auVar83 = vmaxps_avx(auVar64,auVar76);
            pfVar2 = (float *)(uVar33 + 0x80 + uVar40);
            pfVar1 = (float *)(uVar33 + 0x20 + uVar40);
            auVar77._0_4_ = fVar42 * *pfVar2 + *pfVar1;
            auVar77._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
            auVar77._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
            auVar77._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
            auVar52 = vmaxps_avx(auVar52,auVar83);
            auVar83 = vsubps_avx(auVar77,auVar88._0_16_);
            auVar65._0_4_ = auVar98._0_4_ * auVar83._0_4_;
            auVar65._4_4_ = auVar98._4_4_ * auVar83._4_4_;
            auVar65._8_4_ = auVar98._8_4_ * auVar83._8_4_;
            auVar65._12_4_ = auVar98._12_4_ * auVar83._12_4_;
            auVar83 = vminps_avx(auVar108._0_16_,auVar65);
            pfVar2 = (float *)(uVar33 + 0x80 + (uVar39 ^ 0x10));
            pfVar1 = (float *)(uVar33 + 0x20 + (uVar39 ^ 0x10));
            auVar78._0_4_ = fVar42 * *pfVar2 + *pfVar1;
            auVar78._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
            auVar78._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
            auVar78._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
            auVar73 = vsubps_avx(auVar78,auVar90._0_16_);
            auVar79._0_4_ = auVar103._0_4_ * auVar73._0_4_;
            auVar79._4_4_ = auVar103._4_4_ * auVar73._4_4_;
            auVar79._8_4_ = auVar103._8_4_ * auVar73._8_4_;
            auVar79._12_4_ = auVar103._12_4_ * auVar73._12_4_;
            pfVar2 = (float *)(uVar33 + 0x80 + (uVar38 ^ 0x10));
            pfVar1 = (float *)(uVar33 + 0x20 + (uVar38 ^ 0x10));
            auVar80._0_4_ = fVar42 * *pfVar2 + *pfVar1;
            auVar80._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
            auVar80._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
            auVar80._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
            auVar73 = vsubps_avx(auVar80,auVar93._0_16_);
            auVar81._0_4_ = auVar104._0_4_ * auVar73._0_4_;
            auVar81._4_4_ = auVar104._4_4_ * auVar73._4_4_;
            auVar81._8_4_ = auVar104._8_4_ * auVar73._8_4_;
            auVar81._12_4_ = auVar104._12_4_ * auVar73._12_4_;
            auVar73 = vminps_avx(auVar79,auVar81);
            auVar83 = vminps_avx(auVar83,auVar73);
            auVar52 = vcmpps_avx(auVar52,auVar83,2);
            if (((uint)uVar41 & 7) == 6) {
              auVar83 = vcmpps_avx(*(undefined1 (*) [16])(uVar33 + 0xe0),auVar43,2);
              auVar73 = vcmpps_avx(auVar43,*(undefined1 (*) [16])(uVar33 + 0xf0),1);
              auVar83 = vandps_avx(auVar83,auVar73);
              auVar52 = vandps_avx(auVar83,auVar52);
            }
            auVar52 = vpslld_avx(auVar52,0x1f);
            uVar35 = vmovmskps_avx(auVar52);
            if (uVar35 == 0) goto LAB_00b6b22e;
            uVar35 = uVar35 & 0xff;
            lVar37 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            uVar41 = *(ulong *)(uVar33 + lVar37 * 8);
            uVar35 = uVar35 - 1 & uVar35;
            uVar36 = (ulong)uVar35;
          } while (uVar35 == 0);
          do {
            *local_990 = uVar41;
            local_990 = local_990 + 1;
            lVar37 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            uVar41 = *(ulong *)(uVar33 + lVar37 * 8);
            uVar36 = uVar36 - 1 & uVar36;
          } while (uVar36 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_00b6b3c0:
  if (local_9a8 == local_9a0) goto LAB_00b6b22e;
  lVar37 = local_9a8 * 0x140;
  fVar42 = (ray->dir).field_0.m128[3];
  pfVar2 = (float *)(uVar41 + 0x90 + lVar37);
  pfVar1 = (float *)(uVar41 + lVar37);
  auVar85._0_4_ = fVar42 * *pfVar2 + *pfVar1;
  auVar85._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
  auVar85._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
  auVar85._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar41 + 0xa0 + lVar37);
  pfVar1 = (float *)(uVar41 + 0x10 + lVar37);
  auVar87._0_4_ = fVar42 * *pfVar2 + *pfVar1;
  auVar87._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
  auVar87._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
  auVar87._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar41 + 0xb0 + lVar37);
  pfVar1 = (float *)(uVar41 + 0x20 + lVar37);
  auVar89._0_4_ = fVar42 * *pfVar2 + *pfVar1;
  auVar89._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
  auVar89._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
  auVar89._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar41 + 0xc0 + lVar37);
  pfVar1 = (float *)(uVar41 + 0x30 + lVar37);
  auVar53._0_4_ = fVar42 * *pfVar2 + *pfVar1;
  auVar53._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
  auVar53._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
  auVar53._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar41 + 0xd0 + lVar37);
  pfVar1 = (float *)(uVar41 + 0x40 + lVar37);
  auVar66._0_4_ = fVar42 * *pfVar2 + *pfVar1;
  auVar66._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
  auVar66._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
  auVar66._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar41 + 0xe0 + lVar37);
  pfVar1 = (float *)(uVar41 + 0x50 + lVar37);
  auVar92._0_4_ = fVar42 * *pfVar2 + *pfVar1;
  auVar92._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
  auVar92._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
  auVar92._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar41 + 0xf0 + lVar37);
  pfVar1 = (float *)(uVar41 + 0x60 + lVar37);
  auVar97._0_4_ = fVar42 * *pfVar2 + *pfVar1;
  auVar97._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
  auVar97._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
  auVar97._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
  pfVar2 = (float *)(uVar41 + 0x100 + lVar37);
  pfVar1 = (float *)(uVar41 + 0x70 + lVar37);
  auVar102._0_4_ = fVar42 * *pfVar2 + *pfVar1;
  auVar102._4_4_ = fVar42 * pfVar2[1] + pfVar1[1];
  auVar102._8_4_ = fVar42 * pfVar2[2] + pfVar1[2];
  auVar102._12_4_ = fVar42 * pfVar2[3] + pfVar1[3];
  pfVar1 = (float *)(uVar41 + 0x110 + lVar37);
  pfVar2 = (float *)(uVar41 + 0x80 + lVar37);
  auVar44._0_4_ = fVar42 * *pfVar1 + *pfVar2;
  auVar44._4_4_ = fVar42 * pfVar1[1] + pfVar2[1];
  auVar44._8_4_ = fVar42 * pfVar1[2] + pfVar2[2];
  auVar44._12_4_ = fVar42 * pfVar1[3] + pfVar2[3];
  local_9c8 = vsubps_avx(auVar85,auVar53);
  local_a08 = vsubps_avx(auVar87,auVar66);
  auVar52 = vsubps_avx(auVar89,auVar92);
  auVar43 = vsubps_avx(auVar97,auVar85);
  auVar83 = vsubps_avx(auVar102,auVar87);
  auVar73 = vsubps_avx(auVar44,auVar89);
  fVar49 = auVar73._0_4_;
  fVar105 = local_a08._0_4_;
  auVar45._0_4_ = fVar105 * fVar49;
  fVar10 = auVar73._4_4_;
  fVar109 = local_a08._4_4_;
  auVar45._4_4_ = fVar109 * fVar10;
  fVar17 = auVar73._8_4_;
  fVar110 = local_a08._8_4_;
  auVar45._8_4_ = fVar110 * fVar17;
  fVar24 = auVar73._12_4_;
  fVar111 = local_a08._12_4_;
  auVar45._12_4_ = fVar111 * fVar24;
  fVar82 = auVar83._0_4_;
  fVar91 = auVar52._0_4_;
  auVar54._0_4_ = fVar91 * fVar82;
  fVar11 = auVar83._4_4_;
  fVar94 = auVar52._4_4_;
  auVar54._4_4_ = fVar94 * fVar11;
  fVar18 = auVar83._8_4_;
  fVar95 = auVar52._8_4_;
  auVar54._8_4_ = fVar95 * fVar18;
  fVar25 = auVar83._12_4_;
  fVar96 = auVar52._12_4_;
  auVar54._12_4_ = fVar96 * fVar25;
  local_a18 = vsubps_avx(auVar54,auVar45);
  fVar5 = auVar43._0_4_;
  auVar55._0_4_ = fVar91 * fVar5;
  fVar12 = auVar43._4_4_;
  auVar55._4_4_ = fVar94 * fVar12;
  fVar19 = auVar43._8_4_;
  auVar55._8_4_ = fVar95 * fVar19;
  fVar26 = auVar43._12_4_;
  auVar55._12_4_ = fVar96 * fVar26;
  fVar6 = local_9c8._0_4_;
  auVar67._0_4_ = fVar49 * fVar6;
  fVar13 = local_9c8._4_4_;
  auVar67._4_4_ = fVar10 * fVar13;
  fVar20 = local_9c8._8_4_;
  auVar67._8_4_ = fVar17 * fVar20;
  fVar27 = local_9c8._12_4_;
  auVar67._12_4_ = fVar24 * fVar27;
  local_7f8 = vsubps_avx(auVar67,auVar55);
  auVar68._0_4_ = fVar82 * fVar6;
  auVar68._4_4_ = fVar11 * fVar13;
  auVar68._8_4_ = fVar18 * fVar20;
  auVar68._12_4_ = fVar25 * fVar27;
  auVar106._0_4_ = fVar105 * fVar5;
  auVar106._4_4_ = fVar109 * fVar12;
  auVar106._8_4_ = fVar110 * fVar19;
  auVar106._12_4_ = fVar111 * fVar26;
  local_9d8 = vsubps_avx(auVar106,auVar68);
  uVar3 = *(undefined4 *)&(ray->org).field_0;
  auVar107._4_4_ = uVar3;
  auVar107._0_4_ = uVar3;
  auVar107._8_4_ = uVar3;
  auVar107._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar112._4_4_ = uVar3;
  auVar112._0_4_ = uVar3;
  auVar112._8_4_ = uVar3;
  auVar112._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar114._4_4_ = uVar3;
  auVar114._0_4_ = uVar3;
  auVar114._8_4_ = uVar3;
  auVar114._12_4_ = uVar3;
  fVar42 = (ray->dir).field_0.m128[1];
  auVar52 = vsubps_avx(auVar85,auVar107);
  fVar47 = (ray->dir).field_0.m128[2];
  auVar43 = vsubps_avx(auVar87,auVar112);
  auVar83 = vsubps_avx(auVar89,auVar114);
  fVar7 = auVar83._0_4_;
  auVar113._0_4_ = fVar42 * fVar7;
  fVar14 = auVar83._4_4_;
  auVar113._4_4_ = fVar42 * fVar14;
  fVar21 = auVar83._8_4_;
  auVar113._8_4_ = fVar42 * fVar21;
  fVar28 = auVar83._12_4_;
  auVar113._12_4_ = fVar42 * fVar28;
  fVar8 = auVar43._0_4_;
  auVar115._0_4_ = fVar47 * fVar8;
  fVar15 = auVar43._4_4_;
  auVar115._4_4_ = fVar47 * fVar15;
  fVar22 = auVar43._8_4_;
  auVar115._8_4_ = fVar47 * fVar22;
  fVar29 = auVar43._12_4_;
  auVar115._12_4_ = fVar47 * fVar29;
  auVar43 = vsubps_avx(auVar115,auVar113);
  fVar48 = (ray->dir).field_0.m128[0];
  fVar9 = auVar52._0_4_;
  auVar46._0_4_ = fVar47 * fVar9;
  fVar16 = auVar52._4_4_;
  auVar46._4_4_ = fVar47 * fVar16;
  fVar23 = auVar52._8_4_;
  auVar46._8_4_ = fVar47 * fVar23;
  fVar30 = auVar52._12_4_;
  auVar46._12_4_ = fVar47 * fVar30;
  auVar56._0_4_ = fVar48 * fVar7;
  auVar56._4_4_ = fVar48 * fVar14;
  auVar56._8_4_ = fVar48 * fVar21;
  auVar56._12_4_ = fVar48 * fVar28;
  auVar83 = vsubps_avx(auVar56,auVar46);
  auVar57._0_4_ = fVar48 * fVar8;
  auVar57._4_4_ = fVar48 * fVar15;
  auVar57._8_4_ = fVar48 * fVar22;
  auVar57._12_4_ = fVar48 * fVar29;
  auVar69._0_4_ = fVar42 * fVar9;
  auVar69._4_4_ = fVar42 * fVar16;
  auVar69._8_4_ = fVar42 * fVar23;
  auVar69._12_4_ = fVar42 * fVar30;
  auVar73 = vsubps_avx(auVar69,auVar57);
  auVar74 = local_9d8;
  auVar70._0_4_ = fVar48 * local_a18._0_4_ + fVar42 * local_7f8._0_4_ + fVar47 * local_9d8._0_4_;
  auVar70._4_4_ = fVar48 * local_a18._4_4_ + fVar42 * local_7f8._4_4_ + fVar47 * local_9d8._4_4_;
  auVar70._8_4_ = fVar48 * local_a18._8_4_ + fVar42 * local_7f8._8_4_ + fVar47 * local_9d8._8_4_;
  auVar70._12_4_ = fVar48 * local_a18._12_4_ + fVar42 * local_7f8._12_4_ + fVar47 * local_9d8._12_4_
  ;
  auVar58._8_8_ = 0x8000000080000000;
  auVar58._0_8_ = 0x8000000080000000;
  auVar52 = vandps_avx(auVar70,auVar58);
  uVar35 = auVar52._0_4_;
  local_898._0_4_ =
       (float)(uVar35 ^ (uint)(fVar5 * auVar43._0_4_ +
                              fVar82 * auVar83._0_4_ + fVar49 * auVar73._0_4_));
  uVar99 = auVar52._4_4_;
  local_898._4_4_ =
       (float)(uVar99 ^ (uint)(fVar12 * auVar43._4_4_ +
                              fVar11 * auVar83._4_4_ + fVar10 * auVar73._4_4_));
  uVar100 = auVar52._8_4_;
  local_898._8_4_ =
       (float)(uVar100 ^
              (uint)(fVar19 * auVar43._8_4_ + fVar18 * auVar83._8_4_ + fVar17 * auVar73._8_4_));
  uVar101 = auVar52._12_4_;
  local_898._12_4_ =
       (float)(uVar101 ^
              (uint)(fVar26 * auVar43._12_4_ + fVar25 * auVar83._12_4_ + fVar24 * auVar73._12_4_));
  local_888._0_4_ =
       (float)(uVar35 ^ (uint)(auVar43._0_4_ * fVar6 +
                              auVar83._0_4_ * fVar105 + fVar91 * auVar73._0_4_));
  local_888._4_4_ =
       (float)(uVar99 ^ (uint)(auVar43._4_4_ * fVar13 +
                              auVar83._4_4_ * fVar109 + fVar94 * auVar73._4_4_));
  local_888._8_4_ =
       (float)(uVar100 ^
              (uint)(auVar43._8_4_ * fVar20 + auVar83._8_4_ * fVar110 + fVar95 * auVar73._8_4_));
  local_888._12_4_ =
       (float)(uVar101 ^
              (uint)(auVar43._12_4_ * fVar27 + auVar83._12_4_ * fVar111 + fVar96 * auVar73._12_4_));
  auVar83 = ZEXT416(0) << 0x20;
  auVar52 = vcmpps_avx(local_898,auVar83,5);
  auVar43 = vcmpps_avx(local_888,auVar83,5);
  auVar52 = vandps_avx(auVar52,auVar43);
  auVar59._8_4_ = 0x7fffffff;
  auVar59._0_8_ = 0x7fffffff7fffffff;
  auVar59._12_4_ = 0x7fffffff;
  local_868 = vandps_avx(auVar70,auVar59);
  auVar43 = vcmpps_avx(auVar83,auVar70,4);
  auVar52 = vandps_avx(auVar52,auVar43);
  auVar60._0_4_ = local_898._0_4_ + local_888._0_4_;
  auVar60._4_4_ = local_898._4_4_ + local_888._4_4_;
  auVar60._8_4_ = local_898._8_4_ + local_888._8_4_;
  auVar60._12_4_ = local_898._12_4_ + local_888._12_4_;
  auVar43 = vcmpps_avx(auVar60,local_868,2);
  auVar52 = vandps_avx(auVar52,auVar43);
  auVar31._8_8_ = uStack_920;
  auVar31._0_8_ = local_928;
  auVar31 = auVar31 & auVar52;
  if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0') {
    auVar32._8_8_ = uStack_920;
    auVar32._0_8_ = local_928;
    auVar52 = vandps_avx(auVar52,auVar32);
    local_878._0_4_ =
         (float)(uVar35 ^ (uint)(local_a18._0_4_ * fVar9 +
                                local_7f8._0_4_ * fVar8 + fVar7 * local_9d8._0_4_));
    local_878._4_4_ =
         (float)(uVar99 ^ (uint)(local_a18._4_4_ * fVar16 +
                                local_7f8._4_4_ * fVar15 + fVar14 * local_9d8._4_4_));
    local_878._8_4_ =
         (float)(uVar100 ^
                (uint)(local_a18._8_4_ * fVar23 +
                      local_7f8._8_4_ * fVar22 + fVar21 * local_9d8._8_4_));
    local_878._12_4_ =
         (float)(uVar101 ^
                (uint)(local_a18._12_4_ * fVar30 +
                      local_7f8._12_4_ * fVar29 + fVar28 * local_9d8._12_4_));
    fVar42 = (ray->org).field_0.m128[3];
    fVar47 = local_868._0_4_;
    auVar61._0_4_ = fVar47 * fVar42;
    fVar48 = local_868._4_4_;
    auVar61._4_4_ = fVar48 * fVar42;
    fVar49 = local_868._8_4_;
    auVar61._8_4_ = fVar49 * fVar42;
    fVar82 = local_868._12_4_;
    auVar61._12_4_ = fVar82 * fVar42;
    auVar43 = vcmpps_avx(auVar61,local_878,1);
    fVar42 = ray->tfar;
    auVar71._0_4_ = fVar47 * fVar42;
    auVar71._4_4_ = fVar48 * fVar42;
    auVar71._8_4_ = fVar49 * fVar42;
    auVar71._12_4_ = fVar82 * fVar42;
    auVar83 = vcmpps_avx(local_878,auVar71,2);
    auVar43 = vandps_avx(auVar83,auVar43);
    local_848 = vandps_avx(auVar43,auVar52);
    uVar35 = vmovmskps_avx(local_848);
    if (uVar35 != 0) {
      local_808 = local_a18;
      local_7e8 = local_9d8._0_8_;
      uStack_7e0 = local_9d8._8_8_;
      local_9c8._0_8_ = local_9e0->scene;
      auVar52 = vrcpps_avx(local_868);
      fVar42 = auVar52._0_4_;
      auVar62._0_4_ = fVar47 * fVar42;
      fVar47 = auVar52._4_4_;
      auVar62._4_4_ = fVar48 * fVar47;
      fVar48 = auVar52._8_4_;
      auVar62._8_4_ = fVar49 * fVar48;
      fVar49 = auVar52._12_4_;
      auVar62._12_4_ = fVar82 * fVar49;
      auVar72._8_4_ = 0x3f800000;
      auVar72._0_8_ = 0x3f8000003f800000;
      auVar72._12_4_ = 0x3f800000;
      auVar52 = vsubps_avx(auVar72,auVar62);
      fVar42 = fVar42 + fVar42 * auVar52._0_4_;
      fVar47 = fVar47 + fVar47 * auVar52._4_4_;
      fVar48 = fVar48 + fVar48 * auVar52._8_4_;
      fVar49 = fVar49 + fVar49 * auVar52._12_4_;
      local_818[0] = fVar42 * local_878._0_4_;
      local_818[1] = fVar47 * local_878._4_4_;
      local_818[2] = fVar48 * local_878._8_4_;
      local_818[3] = fVar49 * local_878._12_4_;
      local_838._0_4_ = fVar42 * local_898._0_4_;
      local_838._4_4_ = fVar47 * local_898._4_4_;
      local_838._8_4_ = fVar48 * local_898._8_4_;
      local_838._12_4_ = fVar49 * local_898._12_4_;
      local_828._0_4_ = fVar42 * local_888._0_4_;
      local_828._4_4_ = fVar47 * local_888._4_4_;
      local_828._8_4_ = fVar48 * local_888._8_4_;
      local_828._12_4_ = fVar49 * local_888._12_4_;
      uVar33 = (ulong)(uVar35 & 0xff);
      local_9e8 = lVar37 + uVar41;
      local_9d8 = auVar74;
      do {
        uVar36 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
          }
        }
        local_a08._0_8_ = uVar36;
        local_970 = *(uint *)(local_9e8 + 0x120 + uVar36 * 4);
        uVar34 = CONCAT44(0,local_970);
        local_a18._0_8_ = uVar34;
        local_9b0 = *(long *)(*(long *)(local_9c8._0_8_ + 0x1e8) + uVar34 * 8);
        if ((*(uint *)(local_9b0 + 0x34) & ray->mask) == 0) {
          uVar33 = uVar33 ^ 1L << (uVar36 & 0x3f);
        }
        else {
          local_9d8._0_8_ = uVar33;
          if ((local_9e0->args->filter == (RTCFilterFunctionN)0x0) &&
             (local_a18._0_8_ = ray, *(long *)(local_9b0 + 0x48) == 0)) goto LAB_00b6b960;
          local_9f0 = local_9e0->args;
          local_958.context = local_9e0->user;
          local_988 = *(undefined4 *)(local_808 + uVar36 * 4);
          local_984 = *(undefined4 *)(local_7f8 + uVar36 * 4);
          local_980 = *(undefined4 *)((long)&local_7e8 + uVar36 * 4);
          local_97c = *(undefined4 *)(local_838 + uVar36 * 4);
          local_978 = *(undefined4 *)(local_828 + uVar36 * 4);
          local_974 = *(undefined4 *)(local_9e8 + 0x130 + uVar36 * 4);
          local_96c = (local_958.context)->instID[0];
          local_968 = (local_958.context)->instPrimID[0];
          fVar42 = ray->tfar;
          ray->tfar = local_818[uVar36];
          local_a1c = -1;
          local_958.valid = &local_a1c;
          local_958.geometryUserPtr = *(void **)(local_9b0 + 0x18);
          local_a18._0_8_ = ray;
          local_958.hit = (RTCHitN *)&local_988;
          local_958.N = 1;
          local_958.ray = (RTCRayN *)ray;
          if ((*(code **)(local_9b0 + 0x48) == (code *)0x0) ||
             ((**(code **)(local_9b0 + 0x48))(&local_958), *local_958.valid != 0)) {
            if ((local_9f0->filter == (RTCFilterFunctionN)0x0) ||
               (((local_9f0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT && ((*(byte *)(local_9b0 + 0x3e) & 0x40) == 0)))) {
LAB_00b6b960:
              ((Ray *)local_a18._0_8_)->tfar = -INFINITY;
              return;
            }
            (*local_9f0->filter)(&local_958);
            if (*local_958.valid != 0) goto LAB_00b6b960;
          }
          *(float *)(local_a18._0_8_ + 0x20) = fVar42;
          uVar33 = local_9d8._0_8_ ^ 1L << (local_a08._0_8_ & 0x3f);
          ray = (Ray *)local_a18._0_8_;
        }
      } while (uVar33 != 0);
    }
  }
  local_9a8 = local_9a8 + 1;
  auVar88 = ZEXT1664(local_8a8);
  auVar90 = ZEXT1664(local_8b8);
  auVar93 = ZEXT1664(local_8c8);
  auVar98 = ZEXT1664(local_8d8);
  auVar103 = ZEXT1664(local_8e8);
  auVar104 = ZEXT1664(local_8f8);
  auVar86 = ZEXT1664(local_908);
  auVar108 = ZEXT1664(local_918);
  goto LAB_00b6b3c0;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }